

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O1

int __thiscall
dynet::FastLSTMBuilder::copy(FastLSTMBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  pointer pvVar1;
  pointer pvVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  pointer pPVar4;
  ulong uVar5;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  if ((long)(this->params).
            super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->params).
            super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      *(long *)(dst + 0xd8) - *(long *)(dst + 0xd0)) {
    pvVar2 = (this->params).
             super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar2 != (this->params).
                  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      pvVar2 = (pointer)0x0;
      do {
        pvVar1 = (this->params).
                 super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar4 = pvVar1[(long)pvVar2].
                 super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar1[(long)pvVar2].
                     super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl
                     .super__Vector_impl_data + 8) != pPVar4) {
          uVar5 = 0;
          do {
            pPVar4[uVar5].p =
                 *(ParameterStorage **)
                  (*(long *)(*(long *)(dst + 0xd0) + (long)pvVar2 * 0x18) + uVar5 * 8);
            uVar5 = uVar5 + 1;
            pvVar1 = (this->params).
                     super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPVar4 = pvVar1[(long)pvVar2].
                     super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl
                     .super__Vector_impl_data._M_start;
          } while (uVar5 < (ulong)((long)*(pointer *)
                                          ((long)&pvVar1[(long)pvVar2].
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)pPVar4 >> 3));
        }
        pvVar2 = (pointer)((long)&(pvVar2->
                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
      } while (pvVar2 < (pointer)(((long)(this->params).
                                         super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->params).
                                         super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
    }
    return (int)pvVar2;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "Attempt to copy FastLSTMBuilder with different number of parameters (",0x45);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," != ",4);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastLSTMBuilder::copy(const RNNBuilder & rnn) {
  const FastLSTMBuilder & rnn_lstm = (const FastLSTMBuilder&)rnn;
  DYNET_ARG_CHECK(params.size() == rnn_lstm.params.size(),
                          "Attempt to copy FastLSTMBuilder with different number of parameters "
                          "(" << params.size() << " != " << rnn_lstm.params.size() << ")");
  for(size_t i = 0; i < params.size(); ++i)
      for(size_t j = 0; j < params[i].size(); ++j)
        params[i][j] = rnn_lstm.params[i][j];
}